

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O2

void it_xm_fixup_sample_points(IT_SAMPLE *sample)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  
  bVar5 = sample->flags;
  if ((bVar5 & 2) != 0) {
    uVar1 = sample->length;
    uVar3 = sample->loop_start;
    sample->length = (int)uVar1 >> 1;
    sample->loop_start = (int)uVar3 >> 1;
    sample->loop_end = sample->loop_end >> 1;
  }
  if ((bVar5 & 4) == 0) {
    uVar7 = sample->length;
    uVar6 = sample->loop_end;
  }
  else {
    uVar2 = sample->length;
    uVar4 = sample->loop_start;
    uVar7 = (int)uVar2 >> 1;
    sample->length = uVar7;
    sample->loop_start = (int)uVar4 >> 1;
    uVar6 = sample->loop_end >> 1;
    sample->loop_end = uVar6;
  }
  if ((uVar7 < uVar6) || (uVar6 <= (uint)sample->loop_start)) {
    sample->flags = bVar5 & 0xef;
  }
  return;
}

Assistant:

static void it_xm_fixup_sample_points(IT_SAMPLE *sample)
{
	if (sample->flags & IT_SAMPLE_16BIT) {
		sample->length >>= 1;
		sample->loop_start >>= 1;
		sample->loop_end >>= 1;
	}
	if (sample->flags & IT_SAMPLE_STEREO) {
		sample->length >>= 1;
		sample->loop_start >>= 1;
		sample->loop_end >>= 1;
	}

	if ((unsigned int)sample->loop_end > (unsigned int)sample->length)
		sample->flags &= ~IT_SAMPLE_LOOP;
	else if ((unsigned int)sample->loop_start >= (unsigned int)sample->loop_end)
		sample->flags &= ~IT_SAMPLE_LOOP;
}